

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

ON_Curve * __thiscall ON_NurbsSurface::IsoCurve(ON_NurbsSurface *this,int dir,double c)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ON_NurbsCurve *this_00;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  uint uVar13;
  bool bIsRational;
  ON_NurbsCurve N;
  ON_NurbsCurve local_70;
  
  if ((uint)dir < 2) {
    this_00 = (ON_NurbsCurve *)0x0;
    iVar5 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0)
    ;
    if ((char)iVar5 != '\0') {
      bIsRational = this->m_is_rat != 0;
      iVar5 = this->m_dim;
      this_00 = (ON_NurbsCurve *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve
                (this_00,iVar5,bIsRational,this->m_order[(uint)dir],this->m_cv_count[(uint)dir]);
      iVar5 = iVar5 + (uint)bIsRational;
      pdVar8 = this_00->m_knot;
      pdVar3 = this->m_knot[(uint)dir];
      iVar6 = ON_NurbsCurve::KnotCount(this_00);
      memcpy(pdVar8,pdVar3,(long)iVar6 << 3);
      uVar13 = 1 - dir;
      iVar7 = ON_NurbsSpanIndex(this->m_order[uVar13],this->m_cv_count[uVar13],this->m_knot[uVar13],
                                c,1,0);
      iVar6 = 0;
      if ((-1 < iVar7) && (iVar6 = this->m_cv_count[uVar13] - this->m_order[uVar13], iVar7 < iVar6))
      {
        iVar6 = iVar7;
      }
      iVar7 = ON_NurbsCurve::CVCount(this_00);
      ON_NurbsCurve::ON_NurbsCurve
                (&local_70,iVar7 * iVar5,false,this->m_order[uVar13],this->m_order[uVar13]);
      pdVar8 = this->m_knot[uVar13];
      iVar7 = ON_NurbsCurve::KnotCount(&local_70);
      memcpy(local_70.m_knot,pdVar8 + iVar6,(long)iVar7 << 3);
      if (0 < local_70.m_cv_count) {
        iVar7 = 0;
        do {
          pdVar8 = ON_NurbsCurve::CV(&local_70,iVar7);
          iVar1 = this->m_cv_count[(uint)dir];
          if (0 < (long)iVar1) {
            iVar2 = this->m_cv_stride[0];
            pdVar3 = this->m_cv;
            iVar4 = this->m_cv_stride[1];
            if (dir != 0) {
              iVar4 = iVar2;
              iVar2 = this->m_cv_stride[1];
            }
            lVar9 = 0;
            do {
              if (0 < iVar5) {
                lVar10 = lVar9 * iVar2 + (long)(iVar4 * (iVar6 + iVar7));
                pdVar11 = pdVar3 + lVar10;
                if (lVar10 < 0) {
                  pdVar11 = (double *)0x0;
                }
                if (pdVar3 == (double *)0x0) {
                  pdVar11 = (double *)0x0;
                }
                lVar10 = 0;
                lVar12 = 0;
                do {
                  pdVar8[lVar12] = pdVar11[lVar12];
                  lVar12 = lVar12 + 1;
                  lVar10 = lVar10 + -8;
                } while (iVar5 != (int)lVar12);
                pdVar8 = (double *)((long)pdVar8 - lVar10);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != iVar1);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_70.m_cv_count);
      }
      iVar5 = ON_NurbsCurve::Dimension(&local_70);
      ON_NurbsCurve::Evaluate(&local_70,c,0,iVar5,this_00->m_cv,0,(int *)0x0);
      ON_NurbsCurve::~ON_NurbsCurve(&local_70);
    }
  }
  else {
    this_00 = (ON_NurbsCurve *)0x0;
  }
  return &this_00->super_ON_Curve;
}

Assistant:

ON_Curve* ON_NurbsSurface::IsoCurve(
       int dir,          // 0 first parameter varies and second parameter is constant
                         //   e.g., point on IsoCurve(0,c) at t is srf(t,c)
                         // 1 first parameter is constant and second parameter varies
                         //   e.g., point on IsoCurve(1,c) at t is srf(c,t)
       double c          // value of constant parameter 
       ) const
{
  ON_Curve* crv = 0;
  int i,j,k,Scvsize,span_index;
  double* Ncv;
  const double* Scv;
  if ( (dir == 0 || dir == 1) && IsValid() )
  {
    Scvsize = CVSize();
    ON_NurbsCurve* nurbscrv = new ON_NurbsCurve( m_dim, m_is_rat, m_order[dir], m_cv_count[dir] );
    memcpy( nurbscrv->m_knot, m_knot[dir], nurbscrv->KnotCount()*sizeof(*nurbscrv->m_knot) );
    span_index = ON_NurbsSpanIndex(m_order[1-dir],m_cv_count[1-dir],m_knot[1-dir],c,1,0);
    if ( span_index < 0 )
      span_index = 0;
    else if ( span_index > m_cv_count[1-dir]-m_order[1-dir] )
      span_index = m_cv_count[1-dir]-m_order[1-dir];
    ON_NurbsCurve N( Scvsize*nurbscrv->CVCount(), 0, m_order[1-dir], m_order[1-dir] );
    memcpy( N.m_knot, m_knot[1-dir]+span_index, N.KnotCount()*sizeof(*N.m_knot) );
    for ( i = 0; i < N.m_cv_count; i++ ) {
      Ncv = N.CV(i);
      for ( j = 0; j < m_cv_count[dir]; j++ ) {
        Scv = (dir) ? CV(i+span_index,j) : CV(j,i+span_index);
        for ( k = 0; k < Scvsize; k++ )
          *Ncv++ = *Scv++;
      }
    }
    N.Evaluate( c, 0, N.Dimension(), nurbscrv->m_cv );
    crv = nurbscrv;
  }
  return crv;
}